

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O2

int cmd_print(char *arg)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  undefined8 *__ptr;
  char *pcVar3;
  undefined8 *puVar4;
  undefined4 extraout_var;
  char *pcVar5;
  long lVar6;
  FILE *pFVar7;
  int *piVar8;
  uint uVar9;
  size_t __size;
  size_t sStack_70;
  char *local_60;
  undefined4 local_54;
  char *pcStack_50;
  int option_index;
  undefined8 local_48;
  FILE *local_40;
  int local_34;
  
  local_40 = _stdout;
  __ptr = (undefined8 *)malloc(0x10);
  pcVar3 = strdup(arg);
  *__ptr = pcVar3;
  strtok(pcVar3," ");
  iVar2 = -1;
  __size = 0x18;
  while (pcVar3 = strtok((char *)0x0," "), pcVar3 != (char *)0x0) {
    puVar4 = (undefined8 *)realloc(__ptr,__size);
    pFVar7 = _stderr;
    if (puVar4 == (undefined8 *)0x0) {
      iVar2 = 1;
      piVar8 = __errno_location();
      pcVar3 = strerror(*piVar8);
      fprintf(pFVar7,"Memory allocation failed (%s:%d, %s)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/tools/lint/commands.c"
              ,0x178,pcVar3);
      pFVar7 = local_40;
LAB_00107325:
      free((void *)*__ptr);
      free(__ptr);
      if ((pFVar7 != (FILE *)0x0) && (pFVar7 != _stdout)) {
        fclose(pFVar7);
      }
      return iVar2;
    }
    *(char **)((long)puVar4 + (__size - 0x10)) = pcVar3;
    iVar2 = iVar2 + -1;
    __size = __size + 8;
    __ptr = puVar4;
  }
  __ptr[(uint)-iVar2] = 0;
  _optind = 0;
  local_48 = 0;
  uVar9 = 0;
  local_60 = (char *)0x0;
  pcStack_50 = (char *)0x0;
LAB_001070ac:
  local_34 = 3;
switchD_001070e3_caseD_69:
  local_54 = 0;
  iVar1 = getopt_long(-iVar2,__ptr,"hf:go:guP:L:",cmd_print::long_options,&local_54);
  pcVar3 = _optarg;
  switch(iVar1) {
  case 0x66:
    iVar1 = strcmp(_optarg,"yang");
    local_34 = 1;
    if (iVar1 == 0) goto switchD_001070e3_caseD_69;
    iVar1 = strcmp(pcVar3,"yin");
    local_34 = 2;
    if (iVar1 == 0) goto switchD_001070e3_caseD_69;
    local_34 = 2;
    iVar1 = strcmp(pcVar3,"tree");
    local_34 = 3;
    if (iVar1 == 0) goto switchD_001070e3_caseD_69;
    local_34 = 3;
    iVar1 = strcmp(pcVar3,"tree-rfc");
    if (iVar1 == 0) goto LAB_0010721e;
    iVar1 = strcmp(pcVar3,"info");
    local_34 = 4;
    if (iVar1 == 0) goto switchD_001070e3_caseD_69;
    local_34 = 4;
    iVar1 = strcmp(pcVar3,"jsons");
    local_34 = 5;
    if (iVar1 == 0) goto switchD_001070e3_caseD_69;
    pcVar5 = "Unknown output format \"%s\".\n";
    local_34 = 5;
LAB_00107493:
    fprintf(_stderr,pcVar5,pcVar3);
    break;
  case 0x67:
    uVar9 = uVar9 | 2;
    goto switchD_001070e3_caseD_69;
  case 0x68:
    cmd_print_help();
    iVar2 = 0;
    pFVar7 = local_40;
    goto LAB_00107325;
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
    goto switchD_001070e3_caseD_69;
  case 0x6e:
    uVar9 = uVar9 | 8;
    goto switchD_001070e3_caseD_69;
  case 0x6f:
    if (pcStack_50 == (char *)0x0) {
      pcStack_50 = _optarg;
      goto switchD_001070e3_caseD_69;
    }
    pcVar3 = "Output specified twice.\n";
    sStack_70 = 0x18;
LAB_001073e2:
    fwrite(pcVar3,sStack_70,1,_stderr);
    break;
  default:
    if (iVar1 == 0x4c) goto LAB_001071fd;
    if (iVar1 == 0x50) {
      local_60 = _optarg;
      goto switchD_001070e3_caseD_69;
    }
    if (iVar1 == 0x75) {
      uVar9 = uVar9 | 4;
      goto switchD_001070e3_caseD_69;
    }
    if (iVar1 != -1) {
      if (iVar1 == 0x3f) {
        fprintf(_stderr,"Unknown option \"%d\".\n",0x3f);
        break;
      }
      goto switchD_001070e3_caseD_69;
    }
    if (iVar2 + _optind == 0) {
      pcVar3 = "Missing the module name.\n";
      sStack_70 = 0x19;
      goto LAB_001073e2;
    }
    if ((uVar9 != 0 || (int)local_48 != 0) && local_34 != 3) {
      fwrite("--tree options take effect only in case of the tree output format.\n",0x43,1,_stderr);
    }
    pcVar3 = (char *)__ptr[_optind];
    pcVar5 = strchr(pcVar3,0x40);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      *pcVar5 = '\0';
      pcVar5 = pcVar5 + 1;
    }
    lVar6 = ly_ctx_get_module(ctx,pcVar3,pcVar5,0);
    if ((lVar6 != 0) || (lVar6 = ly_ctx_get_submodule(ctx,0,0,pcVar3,pcVar5), lVar6 != 0)) {
      pFVar7 = local_40;
      if ((pcStack_50 == (char *)0x0) ||
         (pFVar7 = fopen(pcStack_50,"w"), __stream = _stderr, pFVar7 != (FILE *)0x0)) {
        iVar1 = local_34;
        iVar2 = lys_print_file(pFVar7,lVar6,local_34,local_60,local_48,uVar9);
        if (iVar1 == 5) {
          fputs("\n",pFVar7);
        }
      }
      else {
        piVar8 = __errno_location();
        pcVar3 = strerror(*piVar8);
        fprintf(__stream,"Could not open the output file (%s).\n",pcVar3);
        iVar2 = 1;
        pFVar7 = (FILE *)0x0;
      }
      goto LAB_00107325;
    }
    if (pcVar5 == (char *)0x0) {
      pcVar5 = "No (sub)module \"%s\" found.\n";
      goto LAB_00107493;
    }
    fprintf(_stderr,"No (sub)module \"%s\" in revision %s found.\n",pcVar3,pcVar5);
  }
  iVar2 = 1;
  pFVar7 = local_40;
  goto LAB_00107325;
LAB_001071fd:
  iVar1 = atoi(_optarg);
  local_48 = CONCAT44(extraout_var,iVar1);
  goto switchD_001070e3_caseD_69;
LAB_0010721e:
  uVar9 = uVar9 | 1;
  goto LAB_001070ac;
}

Assistant:

int
cmd_print(const char *arg)
{
    int c, argc, option_index, ret = 1, tree_ll = 0, tree_opts = 0;
    char **argv = NULL, *ptr, *target_path = NULL, *model_name, *revision;
    const char *out_path = NULL;
    const struct lys_module *module;
    LYS_OUTFORMAT format = LYS_OUT_TREE;
    FILE *output = stdout;
    static struct option long_options[] = {
        {"help", no_argument, 0, 'h'},
        {"format", required_argument, 0, 'f'},
        {"output", required_argument, 0, 'o'},
        {"tree-print-groupings", no_argument, 0, 'g'},
        {"tree-print-uses", no_argument, 0, 'u'},
        {"tree-no-leafref-target", no_argument, 0, 'n'},
        {"tree-path", required_argument, 0, 'P'},
        {"info-path", required_argument, 0, 'P'},
        {"tree-line-length", required_argument, 0, 'L'},
        {NULL, 0, 0, 0}
    };
    void *rlcd;

    argc = 1;
    argv = malloc(2*sizeof *argv);
    *argv = strdup(arg);
    ptr = strtok(*argv, " ");
    while ((ptr = strtok(NULL, " "))) {
        rlcd = realloc(argv, (argc+2)*sizeof *argv);
        if (!rlcd) {
            fprintf(stderr, "Memory allocation failed (%s:%d, %s)", __FILE__, __LINE__, strerror(errno));
            goto cleanup;
        }
        argv = rlcd;
        argv[argc++] = ptr;
    }
    argv[argc] = NULL;

    optind = 0;
    while (1) {
        option_index = 0;
        c = getopt_long(argc, argv, "hf:go:guP:L:", long_options, &option_index);
        if (c == -1) {
            break;
        }

        switch (c) {
        case 'h':
            cmd_print_help();
            ret = 0;
            goto cleanup;
        case 'f':
            if (!strcmp(optarg, "yang")) {
                format = LYS_OUT_YANG;
            } else if (!strcmp(optarg, "yin")) {
                format = LYS_OUT_YIN;
            } else if (!strcmp(optarg, "tree")) {
                format = LYS_OUT_TREE;
            } else if (!strcmp(optarg, "tree-rfc")) {
                format = LYS_OUT_TREE;
                tree_opts |= LYS_OUTOPT_TREE_RFC;
            } else if (!strcmp(optarg, "info")) {
                format = LYS_OUT_INFO;
            } else if (!strcmp(optarg, "jsons")) {
                format = LYS_OUT_JSON;
            } else {
                fprintf(stderr, "Unknown output format \"%s\".\n", optarg);
                goto cleanup;
            }
            break;
        case 'o':
            if (out_path) {
                fprintf(stderr, "Output specified twice.\n");
                goto cleanup;
            }
            out_path = optarg;
            break;
        case 'g':
            tree_opts |= LYS_OUTOPT_TREE_GROUPING;
            break;
        case 'u':
            tree_opts |= LYS_OUTOPT_TREE_USES;
            break;
        case 'n':
            tree_opts |= LYS_OUTOPT_TREE_NO_LEAFREF;
            break;
        case 'P':
            target_path = optarg;
            break;
        case 'L':
            tree_ll = atoi(optarg);
            break;
        case '?':
            fprintf(stderr, "Unknown option \"%d\".\n", (char)c);
            goto cleanup;
        }
    }

    /* file name */
    if (optind == argc) {
        fprintf(stderr, "Missing the module name.\n");
        goto cleanup;
    }

    /* tree fromat with or without gropings */
    if ((tree_opts || tree_ll) && format != LYS_OUT_TREE) {
        fprintf(stderr, "--tree options take effect only in case of the tree output format.\n");
    }

    /* module, revision */
    model_name = argv[optind];
    revision = NULL;
    if (strchr(model_name, '@')) {
        revision = strchr(model_name, '@');
        revision[0] = '\0';
        ++revision;
    }

    module = ly_ctx_get_module(ctx, model_name, revision, 0);
    if (!module) {
        /* not a module, try to find it as a submodule */
        module = (const struct lys_module *)ly_ctx_get_submodule(ctx, NULL, NULL, model_name, revision);
    }

    if (!module) {
        if (revision) {
            fprintf(stderr, "No (sub)module \"%s\" in revision %s found.\n", model_name, revision);
        } else {
            fprintf(stderr, "No (sub)module \"%s\" found.\n", model_name);
        }
        goto cleanup;
    }

    if (out_path) {
        output = fopen(out_path, "w");
        if (!output) {
            fprintf(stderr, "Could not open the output file (%s).\n", strerror(errno));
            goto cleanup;
        }
    }

    ret = lys_print_file(output, module, format, target_path, tree_ll, tree_opts);
    if (format == LYS_OUT_JSON) {
        fputs("\n", output);
    }

cleanup:
    free(*argv);
    free(argv);

    if (output && (output != stdout)) {
        fclose(output);
    }

    return ret;
}